

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ostream.h
# Opt level: O3

NetInterface * operator<<(NetInterface *sink,uint i)

{
  char c;
  byte local_19;
  
  if (9 < i) {
    operator<<(sink,i / 10);
  }
  local_19 = (char)i + (char)(i / 10) * -10 | 0x30;
  (*sink->_vptr_NetInterface[4])(sink,&local_19,1);
  return sink;
}

Assistant:

T& operator<<( T& sink, unsigned int i )
{
  // Handle digits that aren't the lowest digit (if any)
  if ( i >= 10 )
  {
    sink << i/10;
  }

  // Handle the lowest digit
  char c = '0' + (i % 10);
  sink.write( &c, 1 );

  return sink;
}